

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultConverters.cpp
# Opt level: O2

void lateLoadDefaultConverters(void)

{
  int iVar1;
  allocator local_56;
  allocator local_55;
  FunctionPriority local_54;
  string local_50;
  string local_30;
  
  if (lateLoadDefaultConverters()::registerGenericF32toF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericF32toF32);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"F32",&local_55);
      std::__cxx11::string::string((string *)&local_50,"F32",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericF32toF32,
                 &local_30,&local_50,&local_54,genericF32toF32);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericF32toF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS32toS32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS32toS32);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"S32",&local_55);
      std::__cxx11::string::string((string *)&local_50,"S32",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericS32toS32,
                 &local_30,&local_50,&local_54,genericS32toS32);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS32toS32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS16toS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS16toS16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"S16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"S16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericS16toS16,
                 &local_30,&local_50,&local_54,genericS16toS16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS16toS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS8toS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS8toS8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"S8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"S8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericS8toS8,&local_30,
                 &local_50,&local_54,genericS8toS8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS8toS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericF32toS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericF32toS16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"F32",&local_55);
      std::__cxx11::string::string((string *)&local_50,"S16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericF32toS16,
                 &local_30,&local_50,&local_54,genericF32toS16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericF32toS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS16toF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS16toF32);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"S16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"F32",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericS16toF32,
                 &local_30,&local_50,&local_54,genericS16toF32);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS16toF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericF32toU16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericF32toU16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"F32",&local_55);
      std::__cxx11::string::string((string *)&local_50,"U16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericF32toU16,
                 &local_30,&local_50,&local_54,genericF32toU16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericF32toU16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericU16toF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericU16toF32);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"U16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"F32",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericU16toF32,
                 &local_30,&local_50,&local_54,genericU16toF32);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericU16toF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericF32toS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericF32toS8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"F32",&local_55);
      std::__cxx11::string::string((string *)&local_50,"S8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericF32toS8,&local_30
                 ,&local_50,&local_54,genericF32toS8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericF32toS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS8toF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS8toF32);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"S8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"F32",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericS8toF32,&local_30
                 ,&local_50,&local_54,genericS8toF32);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS8toF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericF32toU8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericF32toU8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"F32",&local_55);
      std::__cxx11::string::string((string *)&local_50,"U8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericF32toU8,&local_30
                 ,&local_50,&local_54,genericF32toU8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericF32toU8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericU8toF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericU8toF32);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"U8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"F32",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericU8toF32,&local_30
                 ,&local_50,&local_54,genericU8toF32);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericU8toF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS16toU16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS16toU16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"S16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"U16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericS16toU16,
                 &local_30,&local_50,&local_54,genericS16toU16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS16toU16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericU16toS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericU16toS16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"U16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"S16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericU16toS16,
                 &local_30,&local_50,&local_54,genericU16toS16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericU16toS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS16toS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS16toS8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"S16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"S8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericS16toS8,&local_30
                 ,&local_50,&local_54,genericS16toS8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS16toS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS8toS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS8toS16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"S8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"S16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericS8toS16,&local_30
                 ,&local_50,&local_54,genericS8toS16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS8toS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS16toU8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS16toU8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"S16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"U8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericS16toU8,&local_30
                 ,&local_50,&local_54,genericS16toU8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS16toU8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericU8toS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericU8toS16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"U8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"S16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericU8toS16,&local_30
                 ,&local_50,&local_54,genericU8toS16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericU8toS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericU16toS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericU16toS8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"U16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"S8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericU16toS8,&local_30
                 ,&local_50,&local_54,genericU16toS8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericU16toS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS8toU16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS8toU16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"S8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"U16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericS8toU16,&local_30
                 ,&local_50,&local_54,genericS8toU16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS8toU16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericS8toU8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericS8toU8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"S8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"U8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericS8toU8,&local_30,
                 &local_50,&local_54,genericS8toU8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericS8toU8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericU8toS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericU8toS8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"U8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"S8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericU8toS8,&local_30,
                 &local_50,&local_54,genericU8toS8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericU8toS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCF32toCF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCF32toCF32);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CF32",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CF32",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCF32toCF32,
                 &local_30,&local_50,&local_54,genericCF32toCF32);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCF32toCF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS32toCS32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS32toCS32);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CS32",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CS32",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCS32toCS32,
                 &local_30,&local_50,&local_54,genericCS32toCS32);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS32toCS32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS16toCS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS16toCS16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CS16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CS16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCS16toCS16,
                 &local_30,&local_50,&local_54,genericCS16toCS16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS16toCS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS8toCS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS8toCS8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CS8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CS8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCS8toCS8,
                 &local_30,&local_50,&local_54,genericCS8toCS8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS8toCS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCF32toCS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCF32toCS16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CF32",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CS16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCF32toCS16,
                 &local_30,&local_50,&local_54,genericCF32toCS16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCF32toCS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS16toCF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS16toCF32);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CS16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CF32",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCS16toCF32,
                 &local_30,&local_50,&local_54,genericCS16toCF32);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS16toCF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCF32toCU16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCF32toCU16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CF32",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CU16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCF32toCU16,
                 &local_30,&local_50,&local_54,genericCF32toCU16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCF32toCU16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCU16toCF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCU16toCF32);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CU16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CF32",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCU16toCF32,
                 &local_30,&local_50,&local_54,genericCU16toCF32);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCU16toCF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCF32toCS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCF32toCS8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CF32",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CS8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCF32toCS8,
                 &local_30,&local_50,&local_54,genericCF32toCS8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCF32toCS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS8toCF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS8toCF32);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CS8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CF32",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCS8toCF32,
                 &local_30,&local_50,&local_54,genericCS8toCF32);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS8toCF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCF32toCU8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCF32toCU8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CF32",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CU8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCF32toCU8,
                 &local_30,&local_50,&local_54,genericCF32toCU8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCF32toCU8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCU8toCF32 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCU8toCF32);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CU8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CF32",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCU8toCF32,
                 &local_30,&local_50,&local_54,genericCU8toCF32);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCU8toCF32);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS16toCU16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS16toCU16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CS16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CU16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCS16toCU16,
                 &local_30,&local_50,&local_54,genericCS16toCU16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS16toCU16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCU16toCS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCU16toCS16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CU16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CS16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCU16toCS16,
                 &local_30,&local_50,&local_54,genericCU16toCS16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCU16toCS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS16toCS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS16toCS8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CS16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CS8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCS16toCS8,
                 &local_30,&local_50,&local_54,genericCS16toCS8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS16toCS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS8toCS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS8toCS16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CS8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CS16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCS8toCS16,
                 &local_30,&local_50,&local_54,genericCS8toCS16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS8toCS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS16toCU8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS16toCU8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CS16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CU8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCS16toCU8,
                 &local_30,&local_50,&local_54,genericCS16toCU8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS16toCU8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCU8toCS16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCU8toCS16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CU8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CS16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCU8toCS16,
                 &local_30,&local_50,&local_54,genericCU8toCS16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCU8toCS16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCU16toCS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCU16toCS8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CU16",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CS8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCU16toCS8,
                 &local_30,&local_50,&local_54,genericCU16toCS8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCU16toCS8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS8toCU16 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS8toCU16);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CS8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CU16",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCS8toCU16,
                 &local_30,&local_50,&local_54,genericCS8toCU16);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS8toCU16);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCS8toCU8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCS8toCU8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CS8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CU8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCS8toCU8,
                 &local_30,&local_50,&local_54,genericCS8toCU8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCS8toCU8);
    }
  }
  if (lateLoadDefaultConverters()::registerGenericCU8toCS8 == '\0') {
    iVar1 = __cxa_guard_acquire(&lateLoadDefaultConverters()::registerGenericCU8toCS8);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_30,"CU8",&local_55);
      std::__cxx11::string::string((string *)&local_50,"CS8",&local_56);
      local_54 = GENERIC;
      SoapySDR::ConverterRegistry::ConverterRegistry
                ((ConverterRegistry *)&lateLoadDefaultConverters()::registerGenericCU8toCS8,
                 &local_30,&local_50,&local_54,genericCU8toCS8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      __cxa_guard_release(&lateLoadDefaultConverters()::registerGenericCU8toCS8);
    }
  }
  return;
}

Assistant:

void lateLoadDefaultConverters(void)
{
    static SoapySDR::ConverterRegistry registerGenericF32toF32(SOAPY_SDR_F32, SOAPY_SDR_F32, SoapySDR::ConverterRegistry::GENERIC, &genericF32toF32);
    static SoapySDR::ConverterRegistry registerGenericS32toS32(SOAPY_SDR_S32, SOAPY_SDR_S32, SoapySDR::ConverterRegistry::GENERIC, &genericS32toS32);
    static SoapySDR::ConverterRegistry registerGenericS16toS16(SOAPY_SDR_S16, SOAPY_SDR_S16, SoapySDR::ConverterRegistry::GENERIC, &genericS16toS16);
    static SoapySDR::ConverterRegistry registerGenericS8toS8(SOAPY_SDR_S8, SOAPY_SDR_S8, SoapySDR::ConverterRegistry::GENERIC, &genericS8toS8);
    static SoapySDR::ConverterRegistry registerGenericF32toS16(SOAPY_SDR_F32, SOAPY_SDR_S16, SoapySDR::ConverterRegistry::GENERIC, &genericF32toS16);
    static SoapySDR::ConverterRegistry registerGenericS16toF32(SOAPY_SDR_S16, SOAPY_SDR_F32, SoapySDR::ConverterRegistry::GENERIC, &genericS16toF32);
    static SoapySDR::ConverterRegistry registerGenericF32toU16(SOAPY_SDR_F32, SOAPY_SDR_U16, SoapySDR::ConverterRegistry::GENERIC, &genericF32toU16);
    static SoapySDR::ConverterRegistry registerGenericU16toF32(SOAPY_SDR_U16, SOAPY_SDR_F32, SoapySDR::ConverterRegistry::GENERIC, &genericU16toF32);
    static SoapySDR::ConverterRegistry registerGenericF32toS8(SOAPY_SDR_F32, SOAPY_SDR_S8, SoapySDR::ConverterRegistry::GENERIC, &genericF32toS8);
    static SoapySDR::ConverterRegistry registerGenericS8toF32(SOAPY_SDR_S8, SOAPY_SDR_F32, SoapySDR::ConverterRegistry::GENERIC, &genericS8toF32);
    static SoapySDR::ConverterRegistry registerGenericF32toU8(SOAPY_SDR_F32, SOAPY_SDR_U8, SoapySDR::ConverterRegistry::GENERIC, &genericF32toU8);
    static SoapySDR::ConverterRegistry registerGenericU8toF32(SOAPY_SDR_U8, SOAPY_SDR_F32, SoapySDR::ConverterRegistry::GENERIC, &genericU8toF32);
    static SoapySDR::ConverterRegistry registerGenericS16toU16(SOAPY_SDR_S16, SOAPY_SDR_U16, SoapySDR::ConverterRegistry::GENERIC, &genericS16toU16);
    static SoapySDR::ConverterRegistry registerGenericU16toS16(SOAPY_SDR_U16, SOAPY_SDR_S16, SoapySDR::ConverterRegistry::GENERIC, &genericU16toS16);
    static SoapySDR::ConverterRegistry registerGenericS16toS8(SOAPY_SDR_S16, SOAPY_SDR_S8, SoapySDR::ConverterRegistry::GENERIC, &genericS16toS8);
    static SoapySDR::ConverterRegistry registerGenericS8toS16(SOAPY_SDR_S8, SOAPY_SDR_S16, SoapySDR::ConverterRegistry::GENERIC, &genericS8toS16);
    static SoapySDR::ConverterRegistry registerGenericS16toU8(SOAPY_SDR_S16, SOAPY_SDR_U8, SoapySDR::ConverterRegistry::GENERIC, &genericS16toU8);
    static SoapySDR::ConverterRegistry registerGenericU8toS16(SOAPY_SDR_U8, SOAPY_SDR_S16, SoapySDR::ConverterRegistry::GENERIC, &genericU8toS16);
    static SoapySDR::ConverterRegistry registerGenericU16toS8(SOAPY_SDR_U16, SOAPY_SDR_S8, SoapySDR::ConverterRegistry::GENERIC, &genericU16toS8);
    static SoapySDR::ConverterRegistry registerGenericS8toU16(SOAPY_SDR_S8, SOAPY_SDR_U16, SoapySDR::ConverterRegistry::GENERIC, &genericS8toU16);
    static SoapySDR::ConverterRegistry registerGenericS8toU8(SOAPY_SDR_S8, SOAPY_SDR_U8, SoapySDR::ConverterRegistry::GENERIC, &genericS8toU8);
    static SoapySDR::ConverterRegistry registerGenericU8toS8(SOAPY_SDR_U8, SOAPY_SDR_S8, SoapySDR::ConverterRegistry::GENERIC, &genericU8toS8);
    static SoapySDR::ConverterRegistry registerGenericCF32toCF32(SOAPY_SDR_CF32, SOAPY_SDR_CF32, SoapySDR::ConverterRegistry::GENERIC, &genericCF32toCF32);
    static SoapySDR::ConverterRegistry registerGenericCS32toCS32(SOAPY_SDR_CS32, SOAPY_SDR_CS32, SoapySDR::ConverterRegistry::GENERIC, &genericCS32toCS32);
    static SoapySDR::ConverterRegistry registerGenericCS16toCS16(SOAPY_SDR_CS16, SOAPY_SDR_CS16, SoapySDR::ConverterRegistry::GENERIC, &genericCS16toCS16);
    static SoapySDR::ConverterRegistry registerGenericCS8toCS8(SOAPY_SDR_CS8, SOAPY_SDR_CS8, SoapySDR::ConverterRegistry::GENERIC, &genericCS8toCS8);
    static SoapySDR::ConverterRegistry registerGenericCF32toCS16(SOAPY_SDR_CF32, SOAPY_SDR_CS16, SoapySDR::ConverterRegistry::GENERIC, &genericCF32toCS16);
    static SoapySDR::ConverterRegistry registerGenericCS16toCF32(SOAPY_SDR_CS16, SOAPY_SDR_CF32, SoapySDR::ConverterRegistry::GENERIC, &genericCS16toCF32);
    static SoapySDR::ConverterRegistry registerGenericCF32toCU16(SOAPY_SDR_CF32, SOAPY_SDR_CU16, SoapySDR::ConverterRegistry::GENERIC, &genericCF32toCU16);
    static SoapySDR::ConverterRegistry registerGenericCU16toCF32(SOAPY_SDR_CU16, SOAPY_SDR_CF32, SoapySDR::ConverterRegistry::GENERIC, &genericCU16toCF32);
    static SoapySDR::ConverterRegistry registerGenericCF32toCS8(SOAPY_SDR_CF32, SOAPY_SDR_CS8, SoapySDR::ConverterRegistry::GENERIC, &genericCF32toCS8);
    static SoapySDR::ConverterRegistry registerGenericCS8toCF32(SOAPY_SDR_CS8, SOAPY_SDR_CF32, SoapySDR::ConverterRegistry::GENERIC, &genericCS8toCF32);
    static SoapySDR::ConverterRegistry registerGenericCF32toCU8(SOAPY_SDR_CF32, SOAPY_SDR_CU8, SoapySDR::ConverterRegistry::GENERIC, &genericCF32toCU8);
    static SoapySDR::ConverterRegistry registerGenericCU8toCF32(SOAPY_SDR_CU8, SOAPY_SDR_CF32, SoapySDR::ConverterRegistry::GENERIC, &genericCU8toCF32);
    static SoapySDR::ConverterRegistry registerGenericCS16toCU16(SOAPY_SDR_CS16, SOAPY_SDR_CU16, SoapySDR::ConverterRegistry::GENERIC, &genericCS16toCU16);
    static SoapySDR::ConverterRegistry registerGenericCU16toCS16(SOAPY_SDR_CU16, SOAPY_SDR_CS16, SoapySDR::ConverterRegistry::GENERIC, &genericCU16toCS16);
    static SoapySDR::ConverterRegistry registerGenericCS16toCS8(SOAPY_SDR_CS16, SOAPY_SDR_CS8, SoapySDR::ConverterRegistry::GENERIC, &genericCS16toCS8);
    static SoapySDR::ConverterRegistry registerGenericCS8toCS16(SOAPY_SDR_CS8, SOAPY_SDR_CS16, SoapySDR::ConverterRegistry::GENERIC, &genericCS8toCS16);
    static SoapySDR::ConverterRegistry registerGenericCS16toCU8(SOAPY_SDR_CS16, SOAPY_SDR_CU8, SoapySDR::ConverterRegistry::GENERIC, &genericCS16toCU8);
    static SoapySDR::ConverterRegistry registerGenericCU8toCS16(SOAPY_SDR_CU8, SOAPY_SDR_CS16, SoapySDR::ConverterRegistry::GENERIC, &genericCU8toCS16);
    static SoapySDR::ConverterRegistry registerGenericCU16toCS8(SOAPY_SDR_CU16, SOAPY_SDR_CS8, SoapySDR::ConverterRegistry::GENERIC, &genericCU16toCS8);
    static SoapySDR::ConverterRegistry registerGenericCS8toCU16(SOAPY_SDR_CS8, SOAPY_SDR_CU16, SoapySDR::ConverterRegistry::GENERIC, &genericCS8toCU16);
    static SoapySDR::ConverterRegistry registerGenericCS8toCU8(SOAPY_SDR_CS8, SOAPY_SDR_CU8, SoapySDR::ConverterRegistry::GENERIC, &genericCS8toCU8);
    static SoapySDR::ConverterRegistry registerGenericCU8toCS8(SOAPY_SDR_CU8, SOAPY_SDR_CS8, SoapySDR::ConverterRegistry::GENERIC, &genericCU8toCS8);
}